

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O2

int bcache_write(filemgr *file,bid_t bid,void *buf,bcache_dirty_t dirty,bool final_write,
                bool ignore_if_exist)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  fdb_status fVar4;
  fnamedic_item *pfVar5;
  hash_elem *phVar6;
  list_elem *plVar7;
  fnamedic_item *fname_item;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  avl_node **item;
  avl_tree *tree;
  size_t __n;
  bcache_shard *bshard;
  bool bVar13;
  timeval tp;
  bcache_item query;
  
  pfVar5 = (file->bcache)._M_b._M_p;
  if (pfVar5 == (fnamedic_item *)0x0) {
    pthread_spin_lock(&bcache_lock);
    pfVar5 = (file->bcache)._M_b._M_p;
    if (pfVar5 == (fnamedic_item *)0x0) {
      pfVar5 = _fname_create(file);
    }
    pthread_spin_unlock(&bcache_lock);
  }
  gettimeofday((timeval *)&tp,(__timezone_ptr_t)0x0);
  (pfVar5->access_timestamp).super___atomic_base<unsigned_long>._M_i =
       tp.tv_sec * 1000000 + tp.tv_usec;
  uVar10 = bid % pfVar5->num_shards;
  query.bid = bid;
  pthread_spin_lock(&pfVar5->shards[uVar10].lock);
  phVar6 = hash_find(&pfVar5->shards[uVar10].hashtable,&query.hash_elem);
  if (phVar6 == (hash_elem *)0x0) {
    while( true ) {
      pthread_spin_lock(&freelist_lock);
      plVar7 = list_pop_front(&freelist);
      if (plVar7 != (list_elem *)0x0) break;
      pthread_spin_unlock(&freelist_lock);
      pthread_spin_unlock(&pfVar5->shards[uVar10].lock);
      fname_item = (fnamedic_item *)0x0;
      while (fname_item == (fnamedic_item *)0x0) {
        fname_item = _bcache_get_victim();
        while ((fname_item != (fnamedic_item *)0x0 &&
               ((fname_item->nitems).super___atomic_base<unsigned_long>._M_i == 0))) {
          atomic_decr_uint32_t(&fname_item->ref_count,memory_order_seq_cst);
          fname_item = (fnamedic_item *)0x0;
        }
      }
      atomic_incr_uint64_t(&fname_item->nvictim,memory_order_relaxed);
      uVar2 = fname_item->num_shards;
      iVar3 = rand();
      uVar11 = (ulong)(long)iVar3 % uVar2;
      uVar12 = uVar2;
      do {
        while( true ) {
          bVar13 = uVar12 == 0;
          uVar12 = uVar12 - 1;
          if (bVar13) goto LAB_00105baf;
          uVar8 = uVar11 + 1;
          uVar11 = 0;
          if (uVar8 != uVar2) {
            uVar11 = uVar8;
          }
          bshard = fname_item->shards + uVar11;
          pthread_spin_lock(&bshard->lock);
          bVar13 = _shard_empty(bshard);
          if (!bVar13) break;
LAB_00105b41:
          pthread_spin_unlock(&bshard->lock);
        }
        plVar7 = list_pop_back(&bshard->cleanlist);
        if (plVar7 != (list_elem *)0x0) {
          cVar1 = *(char *)((long)&plVar7[1].prev + 1);
          if ((cVar1 != '\0') && (bcache_global_config.do_not_cache_doc_blocks == false)) {
            *(char *)((long)&plVar7[1].prev + 1) = cVar1 + -1;
            list_push_front(&bshard->cleanlist,plVar7);
            goto LAB_00105b41;
          }
          atomic_decr_uint64_t(&fname_item->nitems,memory_order_seq_cst);
          hash_remove(&bshard->hashtable,(hash_elem *)&plVar7[-2].next);
          _bcache_release_freeblock((bcache_item *)&plVar7[-3].next);
          pthread_spin_unlock(&bshard->lock);
          break;
        }
        pthread_spin_unlock(&bshard->lock);
        fVar4 = _flush_dirty_blocks(fname_item,true,false,false);
      } while (fVar4 == FDB_RESULT_SUCCESS);
LAB_00105baf:
      atomic_decr_uint32_t(&fname_item->ref_count,memory_order_seq_cst);
      pthread_spin_lock(&pfVar5->shards[uVar10].lock);
    }
    LOCK();
    freelist_count.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         ((long)freelist_count.super___atomic_base<unsigned_long>._M_i + -1);
    UNLOCK();
    pthread_spin_unlock(&freelist_lock);
    item = (avl_node **)&plVar7[-3].next;
    phVar6 = hash_find(&pfVar5->shards[uVar10].hashtable,&query.hash_elem);
    if (phVar6 == (hash_elem *)0x0) {
      plVar7[-3].next = (list_elem *)bid;
      LOCK();
      *(undefined1 *)&plVar7[1].prev = 4;
      UNLOCK();
      hash_insert(&pfVar5->shards[uVar10].hashtable,(hash_elem *)&plVar7[-2].next);
    }
    else {
      _bcache_release_freeblock((bcache_item *)item);
      item = &phVar6[-1].avl.left;
    }
  }
  else {
    if (ignore_if_exist) {
      pthread_spin_unlock(&pfVar5->shards[uVar10].lock);
      return 0;
    }
    item = &phVar6[-1].avl.left;
  }
  if ((*(byte *)(item + 7) & 4) != 0) {
    atomic_incr_uint64_t(&pfVar5->nitems,memory_order_seq_cst);
  }
  if (((*(byte *)(item + 7) & 1) == 0) && ((*(byte *)(item + 7) & 4) == 0)) {
    list_remove(&pfVar5->shards[uVar10].cleanlist,(list_elem *)(item + 5));
  }
  LOCK();
  *(byte *)(item + 7) = *(byte *)(item + 7) & 0xfb;
  UNLOCK();
  if (dirty == BCACHE_REQ_DIRTY) {
    if ((*(byte *)(item + 7) & 1) == 0) {
      puVar9 = (undefined8 *)malloc(0x20);
      *puVar9 = item;
      if (*(char *)((long)buf + (long)bcache_blocksize + -1) == -1) {
        tree = &pfVar5->shards[uVar10].tree_idx;
      }
      else {
        if (final_write) {
          LOCK();
          *(byte *)(item + 7) = *(byte *)(item + 7) | 2;
          UNLOCK();
          atomic_incr_uint64_t(&pfVar5->nimmutable,memory_order_seq_cst);
        }
        tree = &pfVar5->shards[uVar10].tree;
      }
      avl_insert(tree,(avl_node *)(puVar9 + 1),_dirty_cmp);
    }
    LOCK();
    *(byte *)(item + 7) = *(byte *)(item + 7) | 1;
    UNLOCK();
  }
  else if ((*(byte *)(item + 7) & 1) == 0) {
    list_push_front(&pfVar5->shards[uVar10].cleanlist,(list_elem *)(item + 5));
    LOCK();
    *(byte *)(item + 7) = *(byte *)(item + 7) & 0xfe;
    UNLOCK();
  }
  __n = (size_t)bcache_blocksize;
  memcpy(item[1],buf,__n);
  *(bool *)((long)item + 0x39) = *(char *)((long)item[1] + (__n - 1)) == -1;
  pthread_spin_unlock(&pfVar5->shards[uVar10].lock);
  return bcache_blocksize;
}

Assistant:

int bcache_write(struct filemgr *file,
                 bid_t bid,
                 void *buf,
                 bcache_dirty_t dirty,
                 bool final_write,
                 bool ignore_if_exist)
{
    struct hash_elem *h = NULL;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname_new;

    fname_new = file->bcache;
    if (fname_new == NULL) {
        spin_lock(&bcache_lock);
        fname_new = file->bcache;
        if (fname_new == NULL) {
            // filename doesn't exist in filename dictionary .. create
            fname_new = _fname_create(file);
        }
        spin_unlock(&bcache_lock);
    }

    // Update the access timestamp.
    struct timeval tp;
    gettimeofday(&tp, NULL);
    atomic_store_uint64_t(&fname_new->access_timestamp,
                          (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                          std::memory_order_relaxed);

    size_t shard_num = bid % fname_new->num_shards;
    // set query
    query.bid = bid;

    spin_lock(&fname_new->shards[shard_num].lock);

    // search hash table
    h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
    if (h == NULL) {
        // cache miss
        // get a free block
        while ((item = _bcache_alloc_freeblock()) == NULL) {
            // no free block .. perform eviction
            spin_unlock(&fname_new->shards[shard_num].lock);

            _bcache_evict(fname_new);

            spin_lock(&fname_new->shards[shard_num].lock);
        }

        // re-search hash table
        h = hash_find(&fname_new->shards[shard_num].hashtable, &query.hash_elem);
        if (h == NULL) {
            // insert into hash table
            item->bid = bid;
            item->flag = BCACHE_FREE;
            hash_insert(&fname_new->shards[shard_num].hashtable, &item->hash_elem);
            h = &item->hash_elem;
        } else {
            // insert into freelist again
            _bcache_release_freeblock(item);
            item = _get_entry(h, struct bcache_item, hash_elem);
        }
    } else {
        // cache hit.
        if (ignore_if_exist) {
            spin_unlock(&fname_new->shards[shard_num].lock);
            return 0;
        }
        item = _get_entry(h, struct bcache_item, hash_elem);
    }

    fdb_assert(h, h, NULL);

    if (item->flag & BCACHE_FREE) {
        atomic_incr_uint64_t(&fname_new->nitems);
    }

    // remove from the list if the block is in clean list
    if (!(item->flag & BCACHE_DIRTY) && !(item->flag & BCACHE_FREE)) {
        list_remove(&fname_new->shards[shard_num].cleanlist, &item->list_elem);
    }
    item->flag &= ~BCACHE_FREE;

    if (dirty == BCACHE_REQ_DIRTY) {
        // DIRTY request
        // to avoid re-insert already existing item into tree
        if (!(item->flag & BCACHE_DIRTY)) {
            // dirty block
            // insert into tree
            struct dirty_item *ditem;
            uint8_t marker;

            ditem = (struct dirty_item *)
                    mempool_alloc(sizeof(struct dirty_item));
            ditem->item = item;

            marker = *((uint8_t*)buf + bcache_blocksize-1);
            if (marker == BLK_MARKER_BNODE) {
                // b-tree node
                avl_insert(&fname_new->shards[shard_num].tree_idx, &ditem->avl, _dirty_cmp);
            } else {
                if (final_write) {
                    item->flag |= BCACHE_IMMUTABLE; // (fully written doc block)
                    atomic_incr_uint64_t(&fname_new->nimmutable);
                }
                avl_insert(&fname_new->shards[shard_num].tree, &ditem->avl,
                           _dirty_cmp);
            }
        }
        item->flag |= BCACHE_DIRTY;
    } else {
        // CLEAN request
        // insert into clean list only when it was originally clean
        if (!(item->flag & BCACHE_DIRTY)) {
            list_push_front(&fname_new->shards[shard_num].cleanlist, &item->list_elem);
            item->flag &= ~(BCACHE_DIRTY);
        }
    }

    memcpy(item->addr, buf, bcache_blocksize);
    _bcache_set_score(item);

    spin_unlock(&fname_new->shards[shard_num].lock);

    return bcache_blocksize;
}